

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O1

void __thiscall BufferBase::pop(BufferBase *this,int len)

{
  Chunk *this_00;
  Mempool *this_01;
  
  this_00 = this->data_buf;
  if ((this_00 != (Chunk *)0x0) && (len <= this_00->length)) {
    Chunk::pop(this_00,len);
    if (this->data_buf->length == 0) {
      this_01 = Mempool::get_instance();
      Mempool::retrieve(this_01,this->data_buf);
      this->data_buf = (Chunk *)0x0;
    }
    return;
  }
  __assert_fail("data_buf != nullptr && len <= data_buf->length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                ,0x19,"void BufferBase::pop(int)");
}

Assistant:

void BufferBase::pop(int len) 
{
    assert(data_buf != nullptr && len <= data_buf->length);

    data_buf->pop(len);
    if(data_buf->length == 0) {
        Mempool::get_instance().retrieve(data_buf);
        data_buf = nullptr;
    }
}